

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Maybe<kj::Promise<void>_> __thiscall
kj::anon_unknown_36::WebSocketImpl::tryPumpFrom(WebSocketImpl *this,WebSocket *other)

{
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 aVar1;
  char cVar2;
  bool bVar3;
  WebSocket *pWVar4;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 in_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 aVar5;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 extraout_RDX;
  byte bVar6;
  Maybe<kj::Promise<void>_> MVar7;
  DebugExpression<bool> _kjCondition;
  Fault f;
  
  if (*(undefined ***)in_RDX != &PTR_send_00702bc8) {
    *(undefined1 *)&(this->super_WebSocket)._vptr_WebSocket = 0;
    aVar5 = in_RDX;
    goto LAB_00415f9d;
  }
  aVar5._1_7_ = in_RDX._1_7_;
  aVar5._0_1_ = (((Maybe<kj::EntropySource_&> *)((long)in_RDX + 0x20))->ptr == (EntropySource *)0x0)
                != (other[4]._vptr_WebSocket == (_func_int **)0x0);
  if ((bool)aVar5._0_1_) {
    cVar2 = *(char *)&other[5]._vptr_WebSocket;
    aVar5._0_1_ = cVar2;
    pWVar4 = (WebSocket *)0x0;
    if (cVar2 != '\0') {
      pWVar4 = other + 6;
    }
    bVar3 = (((Maybe<kj::CompressionParameters> *)((long)in_RDX + 0x28))->ptr).isSet;
    if (cVar2 == '\x01') {
      aVar1 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)((long)in_RDX + 0x30)
      ;
      aVar5 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
      if (bVar3 != false) {
        aVar5 = aVar1;
        if (*(char *)&pWVar4[1]._vptr_WebSocket == '\0') {
          bVar6 = *(byte *)((long)in_RDX + 0x48) ^ 1;
        }
        else {
          if (*(byte *)((long)in_RDX + 0x48) == 0) goto LAB_00415f92;
          bVar6 = pWVar4[2]._vptr_WebSocket == *(_func_int ***)((long)in_RDX + 0x50);
        }
        if (bVar6 != 0) {
          if (*(char *)&pWVar4[3]._vptr_WebSocket == '\0') {
            bVar6 = *(byte *)((long)in_RDX + 0x38) ^ 1;
          }
          else {
            if (*(byte *)((long)in_RDX + 0x38) == 0) goto LAB_00415f92;
            bVar6 = pWVar4[4]._vptr_WebSocket == *(_func_int ***)((long)in_RDX + 0x40);
          }
          if (((bVar6 != 0) && (*(char *)((long)&pWVar4->_vptr_WebSocket + 1) == *(char *)aVar1)) &&
             (*(char *)&pWVar4->_vptr_WebSocket == *(char *)((long)in_RDX + 0x31)))
          goto LAB_00415ef4;
        }
      }
    }
    else if (bVar3 == false) {
LAB_00415ef4:
      bVar6 = *(byte *)((long)&other[0x2c]._vptr_WebSocket + 1);
      _kjCondition.value = (bool)(bVar6 ^ 1);
      if (bVar6 != 0) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[40]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0xba6,FAILED,"!disconnected",
                   "_kjCondition,\"WebSocket can\'t send after disconnect()\"",&_kjCondition,
                   (char (*) [40])"WebSocket can\'t send after disconnect()");
        kj::_::Debug::Fault::fatal(&f);
      }
      bVar6 = *(byte *)((long)&other[0x2c]._vptr_WebSocket + 2);
      _kjCondition.value = (bool)(bVar6 ^ 1);
      if (bVar6 != 0) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[44]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0xba7,FAILED,"!currentlySending",
                   "_kjCondition,\"another message send is already in progress\"",&_kjCondition,
                   (char (*) [44])"another message send is already in progress");
        kj::_::Debug::Fault::fatal(&f);
      }
      *(undefined1 *)((long)&other[0x2c]._vptr_WebSocket + 2) = 1;
      *(undefined1 *)&other[0x2c]._vptr_WebSocket = 1;
      optimizedPumpTo((WebSocketImpl *)&f,(WebSocketImpl *)in_RDX);
      *(undefined1 *)&(this->super_WebSocket)._vptr_WebSocket = 1;
      (this->super_WebSocketErrorHandler)._vptr_WebSocketErrorHandler = (_func_int **)f.exception;
      aVar5 = extraout_RDX;
      goto LAB_00415f9d;
    }
  }
LAB_00415f92:
  *(undefined1 *)&(this->super_WebSocket)._vptr_WebSocket = 0;
LAB_00415f9d:
  MVar7.ptr.field_1 = aVar5;
  MVar7.ptr._0_8_ = this;
  return (Maybe<kj::Promise<void>_>)MVar7.ptr;
}

Assistant:

kj::Maybe<kj::Promise<void>> tryPumpFrom(WebSocket& other) override {
    KJ_IF_SOME(optOther, kj::dynamicDowncastIfAvailable<WebSocketImpl>(other)) {
      // Both WebSockets are raw WebSockets, so we can pump the streams directly rather than read
      // whole messages.

      if ((maskKeyGenerator == kj::none) == (optOther.maskKeyGenerator == kj::none)) {
        // Oops, it appears that we either believe we are the client side of both sockets, or we
        // are the server side of both sockets. Since clients must "mask" their outgoing frames but
        // servers must *not* do so, we can't direct-pump. Sad.
        return kj::none;
      }

      KJ_IF_SOME(config, compressionConfig) {
        KJ_IF_SOME(otherConfig, optOther.compressionConfig) {
          if (config.outboundMaxWindowBits != otherConfig.inboundMaxWindowBits ||
              config.inboundMaxWindowBits != otherConfig.outboundMaxWindowBits ||
              config.inboundNoContextTakeover!= otherConfig.outboundNoContextTakeover ||
              config.outboundNoContextTakeover!= otherConfig.inboundNoContextTakeover) {
            // Compression configurations differ.
            return kj::none;
          }
        } else {
          // Only one websocket uses compression.
          return kj::none;
        }
      } else {
        if (optOther.compressionConfig != kj::none) {
          // Only one websocket uses compression.
          return kj::none;
        }
      }
      // Both websockets use compatible compression configurations so we can pump directly.

      // Check same error conditions as with sendImpl().
      KJ_REQUIRE(!disconnected, "WebSocket can't send after disconnect()");
      KJ_REQUIRE(!currentlySending, "another message send is already in progress");
      currentlySending = true;

      // If the application chooses to pump messages out, but receives incoming messages normally
      // with `receive()`, then we will receive pings and attempt to send pongs. But we can't
      // safely insert a pong in the middle of a pumped stream. We kind of don't have a choice
      // except to drop them on the floor, which is what will happen if we set `hasSentClose` true.
      // Hopefully most apps that set up a pump do so in both directions at once, and so pings will
      // flow through and pongs will flow back.
      hasSentClose = true;

      return optOther.optimizedPumpTo(*this);
    }